

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O1

void __thiscall BloomFilter::BloomFilter(BloomFilter *this,SkipList *memTable)

{
  ulong *puVar1;
  bool bVar2;
  uint64_t *puVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ConstIterator i;
  ConstIterator local_38;
  
  memset(this,0,0x2800);
  local_38 = SkipList::constBegin(memTable);
  bVar2 = SkipList::ConstIterator::hasNext(&local_38);
  if (bVar2) {
    do {
      SkipList::ConstIterator::next(&local_38);
      puVar3 = SkipList::ConstIterator::key(&local_38);
      uVar6 = (ulong)(byte)*puVar3 ^
              ((ulong)*(byte *)((long)puVar3 + 1) << 8 |
              (ulong)*(byte *)((long)puVar3 + 2) << 0x10 |
              (ulong)*(byte *)((long)puVar3 + 3) << 0x18 |
              (ulong)*(byte *)((long)puVar3 + 4) << 0x20 |
              (ulong)*(byte *)((long)puVar3 + 5) << 0x28 |
              (ulong)*(byte *)((long)puVar3 + 6) << 0x30 |
              (ulong)*(byte *)((long)puVar3 + 7) << 0x38);
      uVar4 = (uVar6 * -0x783c846eeebdac2b >> 0x21 | uVar6 * -0x775ed61580000000) *
              0x4cf5ad432745937f ^ 9;
      uVar6 = uVar4 + 9;
      uVar4 = uVar4 + 0x12;
      uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0xae502812aa7333;
      uVar7 = (uVar6 >> 0x21 ^ uVar6) * -0x3b314601e57a13ad;
      uVar6 = (uVar4 >> 0x21 ^ uVar4) * -0xae502812aa7333;
      uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0x3b314601e57a13ad;
      uVar6 = uVar6 >> 0x21 ^ uVar6;
      uVar4 = (uVar7 >> 0x21 ^ uVar7) + uVar6;
      uVar6 = uVar6 + uVar4;
      uVar5 = (int)uVar4 + (int)((uVar4 & 0xffffffff) / 0x14000 << 0xe) * -5;
      puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                        (ulong)(uVar5 >> 3 & 0x3ff8));
      *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
      uVar5 = (int)(uVar4 >> 0x20) + (int)(uVar4 / 0x1400000000000 << 0xe) * -5;
      puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                        (ulong)(uVar5 >> 3 & 0x3ff8));
      *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
      uVar5 = (int)uVar6 + (int)((uVar6 & 0xffffffff) / 0x14000 << 0xe) * -5;
      puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                        (ulong)(uVar5 >> 3 & 0x3ff8));
      *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
      uVar5 = (int)(uVar6 >> 0x20) + (int)(uVar6 / 0x1400000000000 << 0xe) * -5;
      puVar1 = (ulong *)((long)(this->bits).super__Base_bitset<1280UL>._M_w +
                        (ulong)(uVar5 >> 3 & 0x3ff8));
      *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
      bVar2 = SkipList::ConstIterator::hasNext(&local_38);
    } while (bVar2);
  }
  return;
}

Assistant:

BloomFilter::BloomFilter(const SkipList &memTable) {
  auto i = memTable.constBegin();
  while (i.hasNext()) {
    i.next();
    unsigned int hash[4] = {0};
    MurmurHash3_x64_128(&i.key(), sizeof(i.key()), 1, &hash);
    bits[hash[0] % (10240 * 8)] = true;
    bits[hash[1] % (10240 * 8)] = true;
    bits[hash[2] % (10240 * 8)] = true;
    bits[hash[3] % (10240 * 8)] = true;
  }
}